

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

NodeText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeNodeTextWithoutNested
          (NodeText *__return_storage_ptr__,CapnpcCppMain *this,StringPtr namespace_,StringPtr scope
          ,StringPtr name,Schema schema,Array<kj::StringTree> *nestedTypeDecls,
          TemplateContext *templateContext)

{
  int *piVar1;
  ArrayDisposer **this_00;
  Reader proto_00;
  StringPtr scope_00;
  StringPtr scope_01;
  StringPtr scope_02;
  StringPtr name_00;
  Schema SVar2;
  Which WVar3;
  NullableValue<capnp::schema::Value::Reader> *other;
  Reader *pRVar4;
  uint64_t i;
  StructSchema schema_00;
  InterfaceSchema schema_01;
  Array<kj::StringTree> *pAVar5;
  ConstSchema schema_02;
  size_t sVar6;
  StringTree *params;
  StringTree *pSVar7;
  StringPtr *params_6;
  char (*in_stack_fffffffffffff998) [4];
  undefined1 local_500 [8];
  ConstText constText;
  undefined1 local_440 [8];
  InterfaceText interfaceText;
  anon_class_8_1_8991fb9c local_320;
  Mapper<capnp::EnumSchema::EnumerantList_&> local_318;
  Array<kj::StringTree> local_310;
  Schema local_2f8;
  undefined1 local_2f0 [8];
  EnumerantList enumerants;
  undefined1 local_278 [8];
  StructText structText;
  Fault f;
  CappedArray<char,_17UL> hexId;
  Maybe<capnp::schema::Value::Reader> local_e0;
  undefined1 local_a8 [8];
  NullableValue<capnp::schema::Value::Reader> annotatedName;
  Reader proto;
  CapnpcCppMain *this_local;
  Schema schema_local;
  StringPtr scope_local;
  StringPtr namespace__local;
  
  pSVar7 = (StringTree *)scope.content.size_;
  schema_local.raw = (RawBrandedSchema *)scope.content.ptr;
  this_local = (CapnpcCppMain *)schema.raw;
  Schema::getProto((Reader *)&annotatedName.field_1.value._reader.nestingLimit,(Schema *)&this_local
                  );
  proto_00._reader.capTable = (CapTableReader *)proto._reader.segment;
  proto_00._reader.segment = (SegmentReader *)annotatedName.field_1._40_8_;
  proto_00._reader.data = proto._reader.capTable;
  proto_00._reader.pointers = (WirePointer *)proto._reader.data;
  proto_00._reader._32_8_ = proto._reader.pointers;
  proto_00._reader._40_8_ = proto._reader._32_8_;
  annotationValue<capnp::schema::Node::Reader>(&local_e0,this,proto_00,0xf264a779fef191ce);
  other = kj::_::readMaybe<capnp::schema::Value::Reader>(&local_e0);
  kj::_::NullableValue<capnp::schema::Value::Reader>::NullableValue
            ((NullableValue<capnp::schema::Value::Reader> *)local_a8,other);
  kj::Maybe<capnp::schema::Value::Reader>::~Maybe(&local_e0);
  pRVar4 = kj::_::NullableValue::operator_cast_to_Reader_((NullableValue *)local_a8);
  if (pRVar4 != (Reader *)0x0) {
    pRVar4 = kj::_::NullableValue<capnp::schema::Value::Reader>::operator->
                       ((NullableValue<capnp::schema::Value::Reader> *)local_a8);
    name.content = (ArrayPtr<const_char>)capnp::schema::Value::Reader::getText(pRVar4);
  }
  kj::_::NullableValue<capnp::schema::Value::Reader>::~NullableValue
            ((NullableValue<capnp::schema::Value::Reader> *)local_a8);
  piVar1 = &annotatedName.field_1.value._reader.nestingLimit;
  i = capnp::schema::Node::Reader::getId((Reader *)piVar1);
  kj::hex((CappedArray<char,_17UL> *)&f,i);
  WVar3 = capnp::schema::Node::Reader::which((Reader *)piVar1);
  SVar2 = schema_local;
  name_00 = name;
  switch(WVar3) {
  case FILE:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[47]>
              ((Fault *)&structText.sourceDefs.branches.disposer,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
               ,0xafd,FAILED,(char *)0x0,"\"This method shouldn\'t be called on file nodes.\"",
               (char (*) [47])"This method shouldn\'t be called on file nodes.");
    kj::_::Debug::Fault::fatal((Fault *)&structText.sourceDefs.branches.disposer);
  case STRUCT:
    schema_00 = Schema::asStruct((Schema *)&this_local);
    pAVar5 = kj::mv<kj::Array<kj::StringTree>>(nestedTypeDecls);
    piVar1 = &enumerants.list.reader.nestingLimit;
    kj::Array<kj::StringTree>::Array((Array<kj::StringTree> *)piVar1,pAVar5);
    scope_02.content.size_ = (size_t)pSVar7;
    scope_02.content.ptr = (char *)SVar2.raw;
    makeStructText((StructText *)local_278,this,scope_02,name_00,schema_00,
                   (Array<kj::StringTree> *)piVar1,templateContext);
    kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&enumerants.list.reader.nestingLimit)
    ;
    pSVar7 = kj::mv<kj::StringTree>((StringTree *)local_278);
    kj::StringTree::StringTree(&__return_storage_ptr__->outerTypeDecl,pSVar7);
    pSVar7 = kj::mv<kj::StringTree>((StringTree *)&structText.outerTypeDecl.branches.disposer);
    kj::StringTree::StringTree(&__return_storage_ptr__->outerTypeDef,pSVar7);
    pSVar7 = kj::mv<kj::StringTree>((StringTree *)&structText.outerTypeDef.branches.disposer);
    kj::StringTree::StringTree(&__return_storage_ptr__->readerBuilderDefs,pSVar7);
    pSVar7 = kj::mv<kj::StringTree>((StringTree *)&structText.readerBuilderDefs.branches.disposer);
    kj::StringTree::StringTree(&__return_storage_ptr__->inlineMethodDefs,pSVar7);
    kj::strTree<>();
    kj::strTree<>();
    pSVar7 = kj::mv<kj::StringTree>((StringTree *)&structText.inlineMethodDefs.branches.disposer);
    kj::StringTree::StringTree(&__return_storage_ptr__->sourceFileDefs,pSVar7);
    StructText::~StructText((StructText *)local_278);
    break;
  case ENUM:
    local_2f8.raw = (RawBrandedSchema *)Schema::asEnum((Schema *)&this_local);
    EnumSchema::getEnumerants((EnumerantList *)local_2f0,(EnumSchema *)&local_2f8);
    sVar6 = kj::StringPtr::size((StringPtr *)&schema_local);
    if (sVar6 == 0) {
      kj::strTree<>();
    }
    else {
      kj::
      strTree<char_const(&)[29],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[2],kj::StringPtr&,char_const(&)[4]>
                (&__return_storage_ptr__->outerTypeDecl,(kj *)"  typedef ::capnp::schemas::",
                 (char (*) [29])&name,(StringPtr *)0x418074,(char (*) [2])&f,
                 (CappedArray<char,_17UL> *)0x417f09,(char (*) [2])&name,(StringPtr *)0x418bb9,
                 (char (*) [4])proto._reader.capTable);
    }
    interfaceText.sourceDefs.branches.disposer._4_1_ = 1;
    sVar6 = kj::StringPtr::size((StringPtr *)&schema_local);
    if (sVar6 == 0) {
      kj::
      strTree<char_const(&)[27],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[2],kj::StringPtr&,char_const(&)[4]>
                (&__return_storage_ptr__->outerTypeDef,(kj *)0x418829,(char (*) [27])&name,
                 (StringPtr *)0x418074,(char (*) [2])&f,(CappedArray<char,_17UL> *)0x417f09,
                 (char (*) [2])&name,(StringPtr *)0x418bb9,(char (*) [4])proto._reader.capTable);
    }
    else {
      kj::strTree<>();
    }
    interfaceText.sourceDefs.branches.disposer._5_1_ = 1;
    kj::strTree<>();
    interfaceText.sourceDefs.branches.disposer._6_1_ = 1;
    kj::strTree<>();
    interfaceText.sourceDefs.branches.disposer._7_1_ = 1;
    kj::_::Mapper<capnp::EnumSchema::EnumerantList_&>::Mapper(&local_318,(EnumerantList *)local_2f0)
    ;
    local_320.this = this;
    kj::_::Mapper<capnp::EnumSchema::EnumerantList_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2852:15)>
              (&local_310,&local_318,&local_320);
    params_6 = &name;
    kj::
    strTree<char_const(&)[12],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[14],kj::Array<kj::StringTree>,char_const(&)[23],kj::StringPtr&,char_const(&)[3],kj::CappedArray<char,17ul>&,char_const(&)[4]>
              (&__return_storage_ptr__->capnpSchemaDecls,(kj *)"enum class ",(char (*) [12])&name,
               (StringPtr *)0x418074,(char (*) [2])&f,(CappedArray<char,_17UL> *)0x418a99,
               (char (*) [14])&local_310,(Array<kj::StringTree> *)"};\nCAPNP_DECLARE_ENUM(",
               (char (*) [23])&name,(StringPtr *)0x4197eb,(char (*) [3])&f,
               (CappedArray<char,_17UL> *)0x4197d0,in_stack_fffffffffffff998);
    kj::
    strTree<char_const(&)[19],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[3],kj::CappedArray<char,17ul>&,char_const(&)[4]>
              (&__return_storage_ptr__->capnpSchemaDefs,(kj *)"CAPNP_DEFINE_ENUM(",
               (char (*) [19])&name,(StringPtr *)0x418074,(char (*) [2])&f,
               (CappedArray<char,_17UL> *)0x4197eb,(char (*) [3])&f,
               (CappedArray<char,_17UL> *)0x4197d0,(char (*) [4])params_6);
    kj::strTree<>();
    interfaceText.sourceDefs.branches.disposer._7_1_ = 0;
    interfaceText.sourceDefs.branches.disposer._6_1_ = 0;
    interfaceText.sourceDefs.branches.disposer._5_1_ = 0;
    interfaceText.sourceDefs.branches.disposer._4_1_ = 0;
    kj::Array<kj::StringTree>::~Array(&local_310);
    break;
  case INTERFACE:
    this->hasInterfaces = true;
    schema_01 = Schema::asInterface((Schema *)&this_local);
    pAVar5 = kj::mv<kj::Array<kj::StringTree>>(nestedTypeDecls);
    this_00 = &constText.def.branches.disposer;
    kj::Array<kj::StringTree>::Array((Array<kj::StringTree> *)this_00,pAVar5);
    scope_01.content.size_ = (size_t)pSVar7;
    scope_01.content.ptr = (char *)SVar2.raw;
    makeInterfaceText((InterfaceText *)local_440,this,scope_01,name_00,schema_01,
                      (Array<kj::StringTree> *)this_00,templateContext);
    kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&constText.def.branches.disposer);
    pSVar7 = kj::mv<kj::StringTree>((StringTree *)local_440);
    kj::StringTree::StringTree(&__return_storage_ptr__->outerTypeDecl,pSVar7);
    pSVar7 = kj::mv<kj::StringTree>((StringTree *)&interfaceText.outerTypeDecl.branches.disposer);
    kj::StringTree::StringTree(&__return_storage_ptr__->outerTypeDef,pSVar7);
    pSVar7 = kj::mv<kj::StringTree>((StringTree *)&interfaceText.outerTypeDef.branches.disposer);
    kj::StringTree::StringTree(&__return_storage_ptr__->readerBuilderDefs,pSVar7);
    pSVar7 = kj::mv<kj::StringTree>((StringTree *)&interfaceText.clientServerDefs.branches.disposer)
    ;
    kj::StringTree::StringTree(&__return_storage_ptr__->inlineMethodDefs,pSVar7);
    kj::strTree<>();
    kj::strTree<>();
    pSVar7 = kj::mv<kj::StringTree>((StringTree *)&interfaceText.inlineMethodDefs.branches.disposer)
    ;
    kj::StringTree::StringTree(&__return_storage_ptr__->sourceFileDefs,pSVar7);
    InterfaceText::~InterfaceText((InterfaceText *)local_440);
    break;
  case CONST:
    schema_02 = Schema::asConst((Schema *)&this_local);
    scope_00.content.size_ = (size_t)pSVar7;
    scope_00.content.ptr = (char *)SVar2.raw;
    makeConstText((ConstText *)local_500,this,scope_00,name_00,schema_02,templateContext);
    sVar6 = kj::StringPtr::size((StringPtr *)&schema_local);
    if (sVar6 == 0) {
      kj::strTree<>();
    }
    else {
      params = kj::mv<kj::StringTree>((StringTree *)&constText);
      kj::strTree<char_const(&)[3],kj::StringTree>
                (&__return_storage_ptr__->outerTypeDecl,(kj *)0x417f08,(char (*) [3])params,pSVar7);
    }
    sVar6 = kj::StringPtr::size((StringPtr *)&schema_local);
    if (sVar6 == 0) {
      pSVar7 = kj::mv<kj::StringTree>((StringTree *)&constText);
      kj::StringTree::StringTree(&__return_storage_ptr__->outerTypeDef,pSVar7);
    }
    else {
      kj::strTree<>();
    }
    kj::strTree<>();
    kj::strTree<>();
    kj::strTree<>();
    kj::strTree<>();
    pSVar7 = kj::mv<kj::StringTree>((StringTree *)&constText.decl.branches.disposer);
    kj::StringTree::StringTree(&__return_storage_ptr__->sourceFileDefs,pSVar7);
    ConstText::~ConstText((ConstText *)local_500);
    break;
  case ANNOTATION:
    kj::strTree<>();
    kj::strTree<>();
    kj::strTree<>();
    kj::strTree<>();
    kj::strTree<>();
    kj::strTree<>();
    kj::strTree<>();
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

NodeText makeNodeTextWithoutNested(kj::StringPtr namespace_, kj::StringPtr scope,
                                     kj::StringPtr name, Schema schema,
                                     kj::Array<kj::StringTree> nestedTypeDecls,
                                     const TemplateContext& templateContext) {
    auto proto = schema.getProto();
    KJ_IF_MAYBE(annotatedName, annotationValue(proto, NAME_ANNOTATION_ID)) {
      name = annotatedName->getText();
    }
    auto hexId = kj::hex(proto.getId());

    switch (proto.which()) {
      case schema::Node::FILE:
        KJ_FAIL_REQUIRE("This method shouldn't be called on file nodes.");

      case schema::Node::STRUCT: {
        StructText structText =
            makeStructText(scope, name, schema.asStruct(), kj::mv(nestedTypeDecls),
                           templateContext);

        return NodeText {
          kj::mv(structText.outerTypeDecl),
          kj::mv(structText.outerTypeDef),
          kj::mv(structText.readerBuilderDefs),
          kj::mv(structText.inlineMethodDefs),

          kj::strTree(),
          kj::strTree(),

          kj::mv(structText.sourceDefs),
        };
      }

      case schema::Node::ENUM: {
        auto enumerants = schema.asEnum().getEnumerants();

        return NodeText {
          scope.size() == 0 ? kj::strTree() : kj::strTree(
              "  typedef ::capnp::schemas::", name, "_", hexId, " ", name, ";\n"
              "\n"),

          scope.size() > 0 ? kj::strTree() : kj::strTree(
              "typedef ::capnp::schemas::", name, "_", hexId, " ", name, ";\n"
              "\n"),

          kj::strTree(),
          kj::strTree(),

          kj::strTree(
              // We declare enums in the capnp::schemas namespace and then typedef them into
              // place because we don't want them to be parameterized for generics.
              "enum class ", name, "_", hexId, ": uint16_t {\n",
              KJ_MAP(e, enumerants) {
                return kj::strTree("  ", toUpperCase(protoName(e.getProto())), ",\n");
              },
              "};\n"
              "CAPNP_DECLARE_ENUM(", name, ", ", hexId, ");\n"),
          kj::strTree(
              "CAPNP_DEFINE_ENUM(", name, "_", hexId, ", ", hexId, ");\n"),

          kj::strTree(),
        };
      }

      case schema::Node::INTERFACE: {
        hasInterfaces = true;

        InterfaceText interfaceText =
            makeInterfaceText(scope, name, schema.asInterface(), kj::mv(nestedTypeDecls),
                              templateContext);

        return NodeText {
          kj::mv(interfaceText.outerTypeDecl),
          kj::mv(interfaceText.outerTypeDef),
          kj::mv(interfaceText.clientServerDefs),
          kj::mv(interfaceText.inlineMethodDefs),

          kj::strTree(),
          kj::strTree(),

          kj::mv(interfaceText.sourceDefs),
        };
      }

      case schema::Node::CONST: {
        auto constText = makeConstText(scope, name, schema.asConst(), templateContext);

        return NodeText {
          scope.size() == 0 ? kj::strTree() : kj::strTree("  ", kj::mv(constText.decl)),
          scope.size() > 0 ? kj::strTree() : kj::mv(constText.decl),
          kj::strTree(),
          kj::strTree(),

          kj::strTree(),
          kj::strTree(),

          kj::mv(constText.def),
        };
      }

      case schema::Node::ANNOTATION: {
        return NodeText {
          kj::strTree(),
          kj::strTree(),
          kj::strTree(),
          kj::strTree(),

          kj::strTree(),
          kj::strTree(),

          kj::strTree(),
        };
      }
    }

    KJ_UNREACHABLE;
  }